

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::SliderScalarN
               (char *label,ImGuiDataType data_type,void *v,int components,void *v_min,void *v_max,
               char *format,float power)

{
  bool bVar1;
  ImGuiSliderFlags local_40;
  ImGuiSliderFlags slider_flags;
  float power_local;
  void *v_max_local;
  void *v_min_local;
  int components_local;
  void *v_local;
  ImGuiDataType data_type_local;
  char *label_local;
  
  local_40 = 0;
  if ((power != 1.0) || (NAN(power))) {
    bVar1 = false;
    if ((power == 1.0) && (!NAN(power))) {
      bVar1 = true;
    }
    if (!bVar1) {
      __assert_fail("power == 1.0f && \"Call function with ImGuiSliderFlags_Logarithmic flags instead of using the old \'float power\' function!\""
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kentril0[P]OpenGL_Atmospheric_Scattering/src/libs/imgui/imgui_widgets.cpp"
                    ,0xc01,
                    "bool ImGui::SliderScalarN(const char *, ImGuiDataType, void *, int, const void *, const void *, const char *, float)"
                   );
    }
    local_40 = 0x20;
  }
  bVar1 = SliderScalarN(label,data_type,v,components,v_min,v_max,format,local_40);
  return bVar1;
}

Assistant:

bool ImGui::SliderScalarN(const char* label, ImGuiDataType data_type, void* v, int components, const void* v_min, const void* v_max, const char* format, float power)
{
    ImGuiSliderFlags slider_flags = ImGuiSliderFlags_None;
    if (power != 1.0f)
    {
        IM_ASSERT(power == 1.0f && "Call function with ImGuiSliderFlags_Logarithmic flags instead of using the old 'float power' function!");
        slider_flags |= ImGuiSliderFlags_Logarithmic;   // Fallback for non-asserting paths
    }
    return SliderScalarN(label, data_type, v, components, v_min, v_max, format, slider_flags);
}